

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool redit_create(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ROOM_INDEX_DATA *pRVar4;
  char *pcVar5;
  AREA_DATA_conflict *pAVar6;
  char buf [4608];
  char acStack_1228 [4616];
  
  uVar2 = atoi(argument);
  pAVar6 = area_first;
  if ((int)uVar2 < 1 || *argument == '\0') {
    pcVar5 = "Syntax:  create [vnum > 0]\n\r";
  }
  else {
    for (; pAVar6 != (AREA_DATA_conflict *)0x0; pAVar6 = pAVar6->next) {
      if (((int)pAVar6->min_vnum <= (int)uVar2) && ((int)uVar2 <= (int)pAVar6->max_vnum)) {
        bVar1 = is_switched(ch);
        if (bVar1) {
LAB_0035d183:
          pcVar5 = "REdit:  Vnum in an area you cannot build in.\n\r";
        }
        else {
          if (ch->pcdata->security <= pAVar6->security) {
            pcVar5 = pAVar6->builders;
            pcVar3 = strstr(pcVar5,ch->name);
            if ((pcVar3 == (char *)0x0) && (pcVar5 = strstr(pcVar5,"All"), pcVar5 == (char *)0x0))
            goto LAB_0035d183;
          }
          pRVar4 = get_room_index(0);
          if (pRVar4 == (ROOM_INDEX_DATA *)0x0) {
            pRVar4 = new_room_index();
            pRVar4->area = pAVar6;
            pRVar4->vnum = (short)uVar2;
            if (top_vnum_room < (int)uVar2) {
              top_vnum_room = uVar2;
            }
            pRVar4->next = room_index_hash[uVar2 & 0x3ff];
            room_index_hash[uVar2 & 0x3ff] = pRVar4;
            ch->desc->pEdit = pRVar4;
            sprintf(acStack_1228,"Room #%d created.\n\r",(ulong)uVar2);
            send_to_char(acStack_1228,ch);
            return true;
          }
          pcVar5 = "REdit:  Room vnum already exists.\n\r";
        }
        goto LAB_0035d15f;
      }
    }
    pcVar5 = "REdit:  That vnum is not assigned an area.\n\r";
  }
LAB_0035d15f:
  send_to_char(pcVar5,ch);
  return false;
}

Assistant:

bool redit_create(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	ROOM_INDEX_DATA *pRoom;
	int value;
	int iHash;
	char buf[MSL];

	EDIT_ROOM(ch, pRoom);

	value = atoi(argument);

	if (argument[0] == '\0' || value <= 0)
	{
		send_to_char("Syntax:  create [vnum > 0]\n\r", ch);
		return false;
	}

	pArea = get_vnum_area(value);

	if (!pArea)
	{
		send_to_char("REdit:  That vnum is not assigned an area.\n\r", ch);
		return false;
	}

	if (!IS_BUILDER(ch, pArea))
	{
		send_to_char("REdit:  Vnum in an area you cannot build in.\n\r", ch);
		return false;
	}

	if (get_room_index(value))
	{
		send_to_char("REdit:  Room vnum already exists.\n\r", ch);
		return false;
	}

	pRoom = new_room_index();
	pRoom->area = pArea;
	pRoom->vnum = value;

	if (value > top_vnum_room)
		top_vnum_room = value;

	iHash = value % MAX_KEY_HASH;
	pRoom->next = room_index_hash[iHash];
	room_index_hash[iHash] = pRoom;
	ch->desc->pEdit = (void *)pRoom;

	sprintf(buf, "Room #%d created.\n\r", value);
	send_to_char(buf, ch);
	return true;
}